

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O2

int ly_vlog_build_path(LY_VLOG_ELEM elem_type,void *elem,char **path,int schema_all_prefixes,
                      int data_no_last_predicate)

{
  hash_table *__s;
  uint16_t str_len;
  bool bVar1;
  char *pcVar2;
  LYS_NODE LVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  lys_module *plVar8;
  lys_module *plVar9;
  lys_node *plVar10;
  lys_node *plVar11;
  lys_node *node;
  lys_node *node_00;
  char *pcVar12;
  char *pcVar13;
  lys_iffeature **pplVar14;
  size_t sVar15;
  ulong uVar16;
  char *pcVar17;
  ulong uVar18;
  lys_node **pplVar19;
  lys_module *local_78;
  char *local_50;
  uint16_t local_48;
  uint16_t local_34;
  uint16_t local_32 [3];
  uint16_t length;
  uint16_t index;
  
  local_34 = 0;
  pcVar7 = (char *)malloc(1);
  *path = pcVar7;
  if (pcVar7 == (char *)0x0) {
LAB_0010f128:
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_vlog_build_path");
    return -1;
  }
  local_32[0] = 0;
  bVar1 = false;
  node = (lys_node *)0x0;
  local_78 = (lys_module *)0x0;
  node_00 = (lys_node *)elem;
  do {
    if (node_00 == (lys_node *)0x0) {
LAB_0010f16f:
      uVar18 = (ulong)local_34;
      memmove(*path,*path + local_32[0],uVar18);
      (*path)[uVar18] = '\0';
      return 0;
    }
    switch(elem_type) {
    case LY_VLOG_XML:
      if (*(long *)&node_00->nodetype == 0) {
        local_50 = (char *)0x0;
      }
      else {
        local_50 = *(char **)(*(long *)&node_00->nodetype + 0x18);
      }
      pcVar7 = (char *)node_00->module;
LAB_0010eb99:
      pplVar14 = (lys_iffeature **)&node_00->dsc;
      break;
    case LY_VLOG_LYS:
      plVar11 = node_00;
      node = node_00;
      if (local_78 == (lys_module *)0x0) {
        while (plVar10 = lys_parent(plVar11), plVar10 != (lys_node *)0x0) {
          plVar11 = lys_parent(plVar11);
        }
        local_78 = lys_node_module(plVar11);
      }
      do {
        node = lys_parent(node);
        if (node == (lys_node *)0x0) goto LAB_0010eabf;
      } while (node->nodetype == LYS_USES);
      plVar8 = lys_node_module(node_00);
      if ((schema_all_prefixes == 0) && (plVar8 == local_78)) {
        local_50 = (char *)0x0;
      }
      else {
LAB_0010eabf:
        plVar8 = lys_node_module(node_00);
        local_50 = plVar8->name;
      }
      LVar3 = node_00->nodetype;
      if ((LVar3 & (LYS_AUGMENT|LYS_GROUPING)) == LYS_UNKNOWN) {
        pcVar7 = node_00->name;
        if (LVar3 != LYS_EXT) goto LAB_0010eb8b;
        pcVar7 = (char *)((lys_module *)pcVar7)->ctx;
        iVar6 = strcmp(pcVar7,"yang-data");
        if (iVar6 == 0) {
          pcVar7 = node_00->ref;
          plVar8 = lys_node_module(node_00);
          local_50 = plVar8->name;
          LVar3 = node_00->nodetype;
          bVar1 = true;
          goto LAB_0010eb8b;
        }
LAB_0010eb92:
        if (node_00->padding[1] == '\x01') goto LAB_0010eb99;
        node = (lys_node *)0x0;
LAB_0010ebc9:
        node_00 = (lys_node *)0x0;
      }
      else {
        iVar6 = ly_vlog_build_path_print(path,local_32,"]",1,&local_34);
        if (iVar6 != 0) {
          return -1;
        }
        pcVar7 = node_00->name;
        sVar15 = strlen(pcVar7);
        iVar6 = ly_vlog_build_path_print(path,local_32,pcVar7,(uint16_t)sVar15,&local_34);
        if (iVar6 != 0) {
          return -1;
        }
        LVar3 = node_00->nodetype;
        pcVar7 = "{augment}[";
        if (LVar3 == LYS_GROUPING) {
          pcVar7 = "{grouping}[";
        }
LAB_0010eb8b:
        if (LVar3 == LYS_EXT) goto LAB_0010eb92;
        do {
          node = node_00->parent;
          node_00 = lys_parent(node_00);
          if (node_00 == (lys_node *)0x0) goto LAB_0010ebc9;
        } while (node_00->nodetype == LYS_USES);
      }
      goto LAB_0010efea;
    case LY_VLOG_LYD:
      pcVar7 = *(char **)node_00->name;
      if (node_00->iffeature == (lys_iffeature *)0x0) {
LAB_0010ea2d:
        plVar8 = lyd_node_module((lyd_node *)node_00);
        local_50 = plVar8->name;
      }
      else {
        plVar8 = lyd_node_module((lyd_node *)node_00);
        plVar9 = lyd_node_module((lyd_node *)node_00->iffeature);
        if (plVar8 != plVar9) goto LAB_0010ea2d;
        local_50 = (char *)0x0;
      }
      if ((data_no_last_predicate == 0) || (local_32[0] != 0)) {
        pcVar13 = node_00->name;
        if (*(int *)(pcVar13 + 0x38) == 8) {
          if (*(char **)&node_00->nodetype != (char *)0x0) {
            pcVar13 = strchr(*(char **)&node_00->nodetype,0x27);
            pcVar12 = "\"]";
            if (pcVar13 == (char *)0x0) {
              pcVar12 = "\']";
            }
            pcVar17 = "[.=\"";
            if (pcVar13 == (char *)0x0) {
              pcVar17 = "[.=\'";
            }
            iVar6 = ly_vlog_build_path_print(path,local_32,pcVar12,2,&local_34);
            if (iVar6 != 0) {
              return -1;
            }
            pcVar13 = *(char **)&node_00->nodetype;
            sVar15 = strlen(pcVar13);
            iVar6 = ly_vlog_build_path_print(path,local_32,pcVar13,(uint16_t)sVar15,&local_34);
            if (iVar6 != 0) {
              return -1;
            }
            str_len = 4;
LAB_0010ef32:
            iVar6 = ly_vlog_build_path_print(path,local_32,pcVar17,str_len,&local_34);
            if (iVar6 != 0) {
              return -1;
            }
          }
        }
        else if (*(int *)(pcVar13 + 0x38) == 0x10) {
          if ((ulong)(byte)pcVar13[0x1e] == 0) {
            uVar4 = lyd_list_pos((lyd_node *)node_00);
            sVar15 = 2;
            for (uVar5 = uVar4; 9 < (int)uVar5; uVar5 = uVar5 / 10) {
              sVar15 = sVar15 + 1;
            }
            iVar6 = ly_vlog_build_path_print(path,local_32,"]",1,&local_34);
            if (iVar6 != 0) {
              return -1;
            }
            pcVar13 = (char *)malloc(sVar15);
            if (pcVar13 != (char *)0x0) {
              sprintf(pcVar13,"%d",(ulong)uVar4);
              iVar6 = ly_vlog_build_path_print(path,local_32,pcVar13,(short)sVar15 - 1,&local_34);
              free(pcVar13);
              if (iVar6 != 0) {
                return -1;
              }
              pcVar17 = "[";
              str_len = 1;
              goto LAB_0010ef32;
            }
            goto LAB_0010f128;
          }
          uVar18 = (ulong)(byte)pcVar13[0x1e];
LAB_0010ec21:
          uVar16 = uVar18;
          if (0 < (long)uVar16) {
            uVar18 = uVar16 - 1;
            pplVar19 = &node_00->parent;
            while (plVar11 = *pplVar19, plVar11 != (lys_node *)0x0) {
              if ((lys_node *)plVar11->name ==
                  *(lys_node **)(*(long *)(pcVar13 + 0x88) + -8 + uVar16 * 8)) {
                if (*(hash_table **)&plVar11->nodetype != (hash_table *)0x0) {
                  pcVar12 = strchr((char *)*(hash_table **)&plVar11->nodetype,0x27);
                  pcVar17 = "\"]";
                  if (pcVar12 == (char *)0x0) {
                    pcVar17 = "\']";
                  }
                  pcVar2 = "[.=\"";
                  if (pcVar12 == (char *)0x0) {
                    pcVar2 = "[.=\'";
                  }
                  iVar6 = ly_vlog_build_path_print(path,local_32,pcVar17,2,&local_34);
                  if (iVar6 != 0) {
                    return -1;
                  }
                  __s = *(hash_table **)&plVar11->nodetype;
                  sVar15 = strlen((char *)__s);
                  iVar6 = ly_vlog_build_path_print
                                    (path,local_32,(char *)__s,(uint16_t)sVar15,&local_34);
                  if (iVar6 != 0) {
                    return -1;
                  }
                  iVar6 = ly_vlog_build_path_print(path,local_32,pcVar2 + 2,2,&local_34);
                  if (iVar6 != 0) {
                    return -1;
                  }
                  pcVar12 = ((lys_node *)plVar11->name)->name;
                  sVar15 = strlen(pcVar12);
                  iVar6 = ly_vlog_build_path_print(path,local_32,pcVar12,(uint16_t)sVar15,&local_34)
                  ;
                  if (iVar6 != 0) {
                    return -1;
                  }
                  plVar8 = lyd_node_module((lyd_node *)node_00);
                  plVar9 = lyd_node_module((lyd_node *)plVar11);
                  if (plVar8 != plVar9) {
                    iVar6 = ly_vlog_build_path_print(path,local_32,":",1,&local_34);
                    if (iVar6 != 0) {
                      return -1;
                    }
                    plVar8 = lyd_node_module((lyd_node *)plVar11);
                    sVar15 = strlen(plVar8->name);
                    plVar8 = lyd_node_module((lyd_node *)plVar11);
                    local_48 = (uint16_t)sVar15;
                    iVar6 = ly_vlog_build_path_print(path,local_32,plVar8->name,local_48,&local_34);
                    if (iVar6 != 0) {
                      return -1;
                    }
                  }
                  iVar6 = ly_vlog_build_path_print(path,local_32,"[",1,&local_34);
                  if (iVar6 != 0) {
                    return -1;
                  }
                }
                break;
              }
              pplVar19 = (lys_node **)&plVar11->flags;
            }
            goto LAB_0010ec21;
          }
        }
      }
      pplVar14 = &node_00->iffeature;
      if ((*pplVar14 == (lys_iffeature *)0x0) &&
         (plVar8 = (lys_module *)lyp_get_yang_data_template_name((lyd_node *)node_00),
         plVar8 != (lys_module *)0x0)) {
        sVar15 = strlen(pcVar7);
        iVar6 = ly_vlog_build_path_print(path,local_32,pcVar7,(uint16_t)sVar15,&local_34);
        if (iVar6 != 0) {
          return -1;
        }
        bVar1 = true;
        iVar6 = ly_vlog_build_path_print(path,local_32,"/",1,&local_34);
        pcVar7 = (char *)plVar8;
        if (iVar6 != 0) {
          return -1;
        }
      }
      break;
    case LY_VLOG_STR:
      sVar15 = strlen((char *)elem);
      iVar6 = ly_vlog_build_path_print(path,local_32,(char *)elem,(uint16_t)sVar15,&local_34);
      if (iVar6 != 0) {
        return -1;
      }
      goto LAB_0010f16f;
    default:
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/log.c"
             ,0x327);
      return -1;
    }
    node_00 = (lys_node *)*pplVar14;
LAB_0010efea:
    if ((lys_module *)pcVar7 != (lys_module *)0x0) {
      sVar15 = strlen(pcVar7);
      iVar6 = ly_vlog_build_path_print(path,local_32,pcVar7,(uint16_t)sVar15,&local_34);
      if (iVar6 != 0) {
        return -1;
      }
      if (local_50 != (char *)0x0) {
        if ((bVar1) && (iVar6 = ly_vlog_build_path_print(path,local_32,"#",1,&local_34), iVar6 != 0)
           ) {
          return -1;
        }
        iVar6 = ly_vlog_build_path_print(path,local_32,":",1,&local_34);
        if (iVar6 != 0) {
          return -1;
        }
        sVar15 = strlen(local_50);
        iVar6 = ly_vlog_build_path_print(path,local_32,local_50,(uint16_t)sVar15,&local_34);
        if (iVar6 != 0) {
          return -1;
        }
      }
    }
    iVar6 = ly_vlog_build_path_print(path,local_32,"/",1,&local_34);
    if (iVar6 != 0) {
      return -1;
    }
    if ((((elem_type == LY_VLOG_LYS) && (node_00 == (lys_node *)0x0)) && (node != (lys_node *)0x0))
       && (node->nodetype == LYS_AUGMENT)) {
      pcVar7 = node->name;
      sVar15 = strlen(pcVar7);
      iVar6 = ly_vlog_build_path_print(path,local_32,pcVar7,(uint16_t)sVar15,&local_34);
      if (iVar6 != 0) {
        return -1;
      }
    }
  } while( true );
}

Assistant:

int
ly_vlog_build_path(enum LY_VLOG_ELEM elem_type, const void *elem, char **path, int schema_all_prefixes, int data_no_last_predicate)
{
    int i, j, yang_data_extension = 0;
    struct lys_node_list *slist;
    struct lys_node *sparent = NULL;
    struct lyd_node *dlist, *diter;
    const struct lys_module *top_smodule = NULL;
    const char *name, *prefix = NULL, *val_end, *val_start, *ext_name;
    char *str;
    uint16_t length, index;
    size_t len;

    length = 0;
    *path = malloc(1);
    LY_CHECK_ERR_RETURN(!(*path), LOGMEM(NULL), -1);
    index = 0;

    while (elem) {
        switch (elem_type) {
        case LY_VLOG_XML:
            name = ((struct lyxml_elem *)elem)->name;
            prefix = ((struct lyxml_elem *)elem)->ns ? ((struct lyxml_elem *)elem)->ns->prefix : NULL;
            elem = ((struct lyxml_elem *)elem)->parent;
            break;
        case LY_VLOG_LYS:
            if (!top_smodule) {
                /* remember the top module, it will act as the current module */
                for (sparent = (struct lys_node *)elem; lys_parent(sparent); sparent = lys_parent(sparent));
                top_smodule = lys_node_module(sparent);
            }

            /* skip uses */
            sparent = lys_parent((struct lys_node *)elem);
            while (sparent && (sparent->nodetype == LYS_USES)) {
                sparent = lys_parent(sparent);
            }
            if (!sparent || (lys_node_module((struct lys_node *)elem) != top_smodule) || schema_all_prefixes) {
                prefix = lys_node_module((struct lys_node *)elem)->name;
            } else {
                prefix = NULL;
            }

            if (((struct lys_node *)elem)->nodetype & (LYS_AUGMENT | LYS_GROUPING)) {
                if (ly_vlog_build_path_print(path, &index, "]", 1, &length)) {
                    return -1;
                }

                name = ((struct lys_node *)elem)->name;
                if (ly_vlog_build_path_print(path, &index, name, strlen(name), &length)) {
                    return -1;
                }

                if (((struct lys_node *)elem)->nodetype == LYS_GROUPING) {
                    name = "{grouping}[";
                } else { /* augment */
                    name = "{augment}[";
                }
            } else if (((struct lys_node *)elem)->nodetype == LYS_EXT) {
                name = ((struct lys_ext_instance *)elem)->def->name;
                if (!strcmp(name, "yang-data")) {
                    yang_data_extension = 1;
                    name = ((struct lys_ext_instance *)elem)->arg_value;
                    prefix = lys_node_module((struct lys_node *)elem)->name;
                }
            } else {
                name = ((struct lys_node *)elem)->name;
            }

            if (((struct lys_node *)elem)->nodetype == LYS_EXT) {
                if (((struct lys_ext_instance*)elem)->parent_type == LYEXT_PAR_NODE) {
                    elem = (struct lys_node*)((struct lys_ext_instance*)elem)->parent;
                } else {
                    sparent = NULL;
                    elem = NULL;
                }
                break;
            }

            /* need to find the parent again because we don't want to skip augments */
            do {
                sparent = ((struct lys_node *)elem)->parent;
                elem = lys_parent((struct lys_node *)elem);
            } while (elem && (((struct lys_node *)elem)->nodetype == LYS_USES));
            break;
        case LY_VLOG_LYD:
            name = ((struct lyd_node *)elem)->schema->name;
            if (!((struct lyd_node *)elem)->parent ||
                    lyd_node_module((struct lyd_node *)elem) != lyd_node_module(((struct lyd_node *)elem)->parent)) {
                prefix = lyd_node_module((struct lyd_node *)elem)->name;
            } else {
                prefix = NULL;
            }

            /* handle predicates (keys) in case of lists */
            if (!data_no_last_predicate || index) {
                if (((struct lyd_node *)elem)->schema->nodetype == LYS_LIST) {
                    dlist = (struct lyd_node *)elem;
                    slist = (struct lys_node_list *)((struct lyd_node *)elem)->schema;
                    if (slist->keys_size) {
                        /* schema list with keys - use key values in predicates */
                        for (i = slist->keys_size - 1; i > -1; i--) {
                            LY_TREE_FOR(dlist->child, diter) {
                                if (diter->schema == (struct lys_node *)slist->keys[i]) {
                                    break;
                                }
                            }
                            if (diter && ((struct lyd_node_leaf_list *)diter)->value_str) {
                                if (strchr(((struct lyd_node_leaf_list *)diter)->value_str, '\'')) {
                                    val_start = "=\"";
                                    val_end = "\"]";
                                } else {
                                    val_start = "='";
                                    val_end = "']";
                                }

                                /* print value */
                                if (ly_vlog_build_path_print(path, &index, val_end, 2, &length)) {
                                    return -1;
                                }
                                len = strlen(((struct lyd_node_leaf_list *)diter)->value_str);
                                if (ly_vlog_build_path_print(path, &index,
                                        ((struct lyd_node_leaf_list *)diter)->value_str, len, &length)) {
                                    return -1;
                                }

                                /* print schema name */
                                if (ly_vlog_build_path_print(path, &index, val_start, 2, &length)) {
                                    return -1;
                                }
                                len = strlen(diter->schema->name);
                                if (ly_vlog_build_path_print(path, &index, diter->schema->name, len, &length)) {
                                    return -1;
                                }

                                if (lyd_node_module(dlist) != lyd_node_module(diter)) {
                                    if (ly_vlog_build_path_print(path, &index, ":", 1, &length)) {
                                        return -1;
                                    }
                                    len = strlen(lyd_node_module(diter)->name);
                                    if (ly_vlog_build_path_print(path, &index, lyd_node_module(diter)->name, len, &length)) {
                                        return -1;
                                    }
                                }

                                if (ly_vlog_build_path_print(path, &index, "[", 1, &length)) {
                                    return -1;
                                }
                            }
                        }
                    } else {
                        /* schema list without keys - use instance position */
                        i = j = lyd_list_pos(dlist);
                        len = 1;
                        while (j > 9) {
                            ++len;
                            j /= 10;
                        }

                        if (ly_vlog_build_path_print(path, &index, "]", 1, &length)) {
                            return -1;
                        }

                        str = malloc(len + 1);
                        LY_CHECK_ERR_RETURN(!str, LOGMEM(NULL), -1);
                        sprintf(str, "%d", i);

                        if (ly_vlog_build_path_print(path, &index, str, len, &length)) {
                            free(str);
                            return -1;
                        }
                        free(str);

                        if (ly_vlog_build_path_print(path, &index, "[", 1, &length)) {
                            return -1;
                        }
                    }
                } else if (((struct lyd_node *)elem)->schema->nodetype == LYS_LEAFLIST &&
                        ((struct lyd_node_leaf_list *)elem)->value_str) {
                    if (strchr(((struct lyd_node_leaf_list *)elem)->value_str, '\'')) {
                        val_start = "[.=\"";
                        val_end = "\"]";
                    } else {
                        val_start = "[.='";
                        val_end = "']";
                    }

                    if (ly_vlog_build_path_print(path, &index, val_end, 2, &length)) {
                        return -1;
                    }
                    len = strlen(((struct lyd_node_leaf_list *)elem)->value_str);
                    if (ly_vlog_build_path_print(path, &index, ((struct lyd_node_leaf_list *)elem)->value_str, len, &length)) {
                        return -1;
                    }
                    if (ly_vlog_build_path_print(path, &index, val_start, 4, &length)) {
                        return -1;
                    }
                }
            }

            /* check if it is yang-data top element */
            if (!((struct lyd_node *)elem)->parent) {
                ext_name = lyp_get_yang_data_template_name(elem);
                if (ext_name) {
                    if (ly_vlog_build_path_print(path, &index, name, strlen(name), &length)) {
                        return -1;
                    }
                    if (ly_vlog_build_path_print(path, &index, "/", 1, &length)) {
                        return -1;
                    }
                    yang_data_extension = 1;
                    name = ext_name;
               }
            }

            elem = ((struct lyd_node *)elem)->parent;
            break;
        case LY_VLOG_STR:
            len = strlen((const char *)elem);
            if (ly_vlog_build_path_print(path, &index, (const char *)elem, len, &length)) {
                return -1;
            }
            goto success;
        default:
            /* shouldn't be here */
            LOGINT(NULL);
            return -1;
        }
        if (name) {
            if (ly_vlog_build_path_print(path, &index, name, strlen(name), &length)) {
                return -1;
            }
            if (prefix) {
                if (yang_data_extension && ly_vlog_build_path_print(path, &index, "#", 1, &length)) {
                    return -1;
                }
                if (ly_vlog_build_path_print(path, &index, ":", 1, &length)) {
                    return -1;
                }
                if (ly_vlog_build_path_print(path, &index, prefix, strlen(prefix), &length)) {
                    return -1;
                }
            }
        }
        if (ly_vlog_build_path_print(path, &index, "/", 1, &length)) {
            return -1;
        }
        if ((elem_type == LY_VLOG_LYS) && !elem && sparent && (sparent->nodetype == LYS_AUGMENT)) {
            len = strlen(((struct lys_node_augment *)sparent)->target_name);
            if (ly_vlog_build_path_print(path, &index, ((struct lys_node_augment *)sparent)->target_name, len, &length)) {
                return -1;
            }
        }
    }

success:
    memmove(*path, (*path) + index, length);
    (*path)[length] = '\0';
    return 0;
}